

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O1

float Am_Clip_And_Map(float val,float val_1,float val_2,float target_val_1,float target_val_2)

{
  float fVar1;
  
  if ((val_1 != val_2) || (NAN(val_1) || NAN(val_2))) {
    if (((((val_1 <= val) || (fVar1 = target_val_1, val_2 <= val_1)) &&
         ((fVar1 = target_val_2, val_2 <= val_1 || (val <= val_2)))) &&
        ((val_2 <= val || (val_1 <= val_2)))) &&
       ((val <= val_1 || (fVar1 = target_val_1, val_1 <= val_2)))) {
      fVar1 = target_val_1 + ((target_val_2 - target_val_1) * (val - val_1)) / (val_2 - val_1);
    }
  }
  else {
    fVar1 = (float)((uint)target_val_1 & -(uint)(val < val_1) |
                   ~-(uint)(val < val_1) & (uint)target_val_2);
  }
  return fVar1;
}

Assistant:

float
Am_Clip_And_Map(float val, float val_1, float val_2, float target_val_1,
                float target_val_2)
{
  if (val_1 == val_2) {
    if (val < val_1)
      return target_val_1;
    else
      return target_val_2;
  } else { // val_1 != val_2
    if (val < val_1 && val_1 < val_2)
      return target_val_1;
    else if (val_1 < val_2 && val_2 < val)
      return target_val_2;
    else if (val < val_2 && val_2 < val_1)
      return target_val_2;
    else if (val_2 < val_1 && val_1 < val)
      return target_val_1;
    else
      return target_val_1 +
             ((val - val_1) * (target_val_2 - target_val_1) / (val_2 - val_1));
  }
}